

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

iterator __thiscall
cmComputeLinkDepends::AllocateLinkEntry(cmComputeLinkDepends *this,cmLinkItem *item)

{
  pointer pLVar1;
  pointer pLVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_cmLinkItem,_int>_>,_bool> pVar3;
  DependSetList *local_60;
  value_type index_entry;
  
  pLVar1 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pLVar2 = (this->EntryList).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cmLinkItem::cmLinkItem(&index_entry.first,item);
  index_entry.second = (int)(((long)pLVar1 - (long)pLVar2) / 0x30);
  pVar3 = std::
          _Rb_tree<cmLinkItem,std::pair<cmLinkItem_const,int>,std::_Select1st<std::pair<cmLinkItem_const,int>>,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
          ::_M_emplace_unique<std::pair<cmLinkItem_const,int>&>
                    ((_Rb_tree<cmLinkItem,std::pair<cmLinkItem_const,int>,std::_Select1st<std::pair<cmLinkItem_const,int>>,std::less<cmLinkItem>,std::allocator<std::pair<cmLinkItem_const,int>>>
                      *)&this->LinkEntryIndex,&index_entry);
  std::vector<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>::
  emplace_back<>(&this->EntryList);
  local_60 = (DependSetList *)0x0;
  std::
  vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>
  ::emplace_back<cmComputeLinkDepends::DependSetList*>
            ((vector<cmComputeLinkDepends::DependSetList*,std::allocator<cmComputeLinkDepends::DependSetList*>>
              *)&this->InferredDependSets,&local_60);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::emplace_back<>
            (&(this->EntryConstraintGraph).
              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>);
  cmLinkItem::~cmLinkItem(&index_entry.first);
  return (iterator)pVar3.first._M_node._M_node;
}

Assistant:

std::map<cmLinkItem, int>::iterator cmComputeLinkDepends::AllocateLinkEntry(
  cmLinkItem const& item)
{
  std::map<cmLinkItem, int>::value_type index_entry(
    item, static_cast<int>(this->EntryList.size()));
  std::map<cmLinkItem, int>::iterator lei =
    this->LinkEntryIndex.insert(index_entry).first;
  this->EntryList.emplace_back();
  this->InferredDependSets.push_back(nullptr);
  this->EntryConstraintGraph.emplace_back();
  return lei;
}